

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall IteratorTest::constructorTest<false>(IteratorTest *this)

{
  int iVar1;
  reference piVar2;
  reference piVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar5;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar6;
  logic_error *plVar7;
  code *pcVar8;
  undefined *puVar9;
  long lVar10;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it_1;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  int scalar;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_f8;
  undefined1 local_c8 [8];
  pointer piStack_c0;
  size_t *local_b8;
  pointer puStack_b0;
  pointer local_a8;
  pointer puStack_a0;
  size_t local_98;
  CoordinateOrder local_90;
  bool local_8c;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_88;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_58;
  
  local_a8 = (pointer)0x0;
  puStack_a0 = (pointer)0x0;
  local_b8 = (size_t *)0x0;
  puStack_b0 = (pointer)0x0;
  local_c8 = (undefined1  [8])0x0;
  piStack_c0 = (pointer)0x0;
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  if (local_b8 != (size_t *)0x0) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (puStack_b0 != (pointer)0x0) {
    operator_delete(puStack_b0,(long)puStack_a0 - (long)puStack_b0);
  }
  local_58.view_._0_4_ = 0x2a;
  local_c8 = (undefined1  [8])&local_58;
  local_b8 = (size_t *)operator_new(0);
  puStack_a0 = (pointer)0x0;
  local_98 = 1;
  local_90 = LastMajorOrder;
  local_8c = true;
  puStack_b0 = local_b8;
  local_a8 = local_b8;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            (&local_f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,0);
  if ((local_f8.view_ == (view_pointer)0x0) ||
     ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
    pcVar8 = std::runtime_error::~runtime_error;
    puVar9 = &std::runtime_error::typeinfo;
LAB_001bb7e5:
    __cxa_throw(plVar7,puVar9,pcVar8);
  }
  iVar1 = *local_f8.pointer_;
  local_88.view_ = (view_pointer)((ulong)local_88.view_ & 0xffffffff00000000);
  piVar2 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>
                     ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,(int *)&local_88)
  ;
  if (iVar1 != *piVar2) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    pcVar8 = std::logic_error::~logic_error;
    puVar9 = &std::logic_error::typeinfo;
    goto LAB_001bb7e5;
  }
  if (local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(local_b8,(long)puStack_a0 * 0x18);
  local_58.view_._0_4_ = 0x2a;
  local_c8 = (undefined1  [8])&local_58;
  local_b8 = (size_t *)operator_new(0);
  puStack_a0 = (pointer)0x0;
  local_98 = 1;
  local_90 = LastMajorOrder;
  local_8c = true;
  puStack_b0 = local_b8;
  local_a8 = local_b8;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,0);
  if ((local_f8.view_ == (view_pointer)0x0) ||
     ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
    pcVar8 = std::runtime_error::~runtime_error;
    puVar9 = &std::runtime_error::typeinfo;
LAB_001bb817:
    __cxa_throw(plVar7,puVar9,pcVar8);
  }
  iVar1 = *local_f8.pointer_;
  local_88.view_ = (view_pointer)((ulong)local_88.view_ & 0xffffffff00000000);
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,true,std::allocator<unsigned_long>>
                     ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,(int *)&local_88);
  if (iVar1 != *piVar3) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    pcVar8 = std::logic_error::~logic_error;
    puVar9 = &std::logic_error::typeinfo;
    goto LAB_001bb817;
  }
  if (local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(local_b8,(long)puStack_a0 * 0x18);
  local_58.view_._0_4_ = 0x2a;
  local_c8 = (undefined1  [8])&local_58;
  local_b8 = (size_t *)operator_new(0);
  puStack_a0 = (pointer)0x0;
  local_98 = 1;
  local_90 = LastMajorOrder;
  local_8c = true;
  puStack_b0 = local_b8;
  local_a8 = local_b8;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,0);
  if ((local_f8.view_ == (view_pointer)0x0) ||
     ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
    pcVar8 = std::runtime_error::~runtime_error;
    puVar9 = &std::runtime_error::typeinfo;
LAB_001bb849:
    __cxa_throw(plVar7,puVar9,pcVar8);
  }
  iVar1 = *local_f8.pointer_;
  local_88.view_ = (view_pointer)((ulong)local_88.view_ & 0xffffffff00000000);
  piVar2 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>
                     ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,(int *)&local_88)
  ;
  if (iVar1 != *piVar2) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test failed.");
    pcVar8 = std::logic_error::~logic_error;
    puVar9 = &std::logic_error::typeinfo;
    goto LAB_001bb849;
  }
  if (local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(local_b8,(long)puStack_a0 * 0x18);
  _Var4._M_current = (unsigned_long *)operator_new(8);
  *_Var4._M_current = 0x18;
  local_c8 = (undefined1  [8])this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)&piStack_c0,_Var4,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            (&local_f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,0);
  lVar10 = 0;
  do {
    if ((local_f8.view_ == (view_pointer)0x0) ||
       ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
      pcVar8 = std::runtime_error::~runtime_error;
      puVar9 = &std::runtime_error::typeinfo;
LAB_001bada1:
      __cxa_throw(plVar7,puVar9,pcVar8);
    }
    if (*local_f8.pointer_ != this->data_[lVar10]) {
      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar7,"test failed.");
      pcVar8 = std::logic_error::~logic_error;
      puVar9 = &std::logic_error::typeinfo;
      goto LAB_001bada1;
    }
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_f8);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x18);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,local_98);
  if (local_f8.view_ == (view_pointer)0x0) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
  }
  else {
    if (local_88.view_ == local_f8.view_) {
      if (local_f8.index_ == local_88.index_) {
        pIVar5 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&local_f8)
        ;
        if ((pIVar5->view_ == (view_pointer)0x0) ||
           ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
          goto LAB_001bb88b;
        }
        if (*pIVar5->pointer_ == 0x2e) {
          if (local_88.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_88.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_f8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_f8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          operator_delete(local_b8,(long)puStack_a0 * 0x18);
          operator_delete(_Var4._M_current,8);
          _Var4._M_current = (unsigned_long *)operator_new(8);
          *_Var4._M_current = 0x18;
          local_c8 = (undefined1  [8])this;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)&piStack_c0,_Var4,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)&local_f8);
          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8,
                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,0);
          lVar10 = 0;
          do {
            if ((local_f8.view_ == (view_pointer)0x0) ||
               ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
              pcVar8 = std::runtime_error::~runtime_error;
              puVar9 = &std::runtime_error::typeinfo;
LAB_001badd3:
              __cxa_throw(plVar7,puVar9,pcVar8);
            }
            if (*local_f8.pointer_ != this->data_[lVar10]) {
              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar7,"test failed.");
              pcVar8 = std::logic_error::~logic_error;
              puVar9 = &std::logic_error::typeinfo;
              goto LAB_001badd3;
            }
            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x18);
          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_88,
                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,local_98);
          if (local_f8.view_ == (view_pointer)0x0) {
            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
          }
          else {
            if (local_88.view_ == local_f8.view_) {
              if (local_f8.index_ == local_88.index_) {
                pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                   ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8
                                   );
                if ((pIVar6->view_ == (view_pointer)0x0) ||
                   ((pIVar6->view_->geometry_).size_ <= pIVar6->index_)) {
                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
                  goto LAB_001bb8db;
                }
                if (*pIVar6->pointer_ == 0x2e) {
                  if (local_88.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_88.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_88.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_88.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_f8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_f8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                  operator_delete(_Var4._M_current,8);
                  _Var4._M_current = (unsigned_long *)operator_new(8);
                  *_Var4._M_current = 0x18;
                  local_c8 = (undefined1  [8])this;
                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((Geometry<std::allocator<unsigned_long>> *)&piStack_c0,_Var4,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                             (allocator_type *)&local_f8);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8,
                             (View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,0);
                  lVar10 = 0;
                  do {
                    if ((local_f8.view_ == (view_pointer)0x0) ||
                       ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.")
                      ;
                      pcVar8 = std::runtime_error::~runtime_error;
                      puVar9 = &std::runtime_error::typeinfo;
LAB_001bae05:
                      __cxa_throw(plVar7,puVar9,pcVar8);
                    }
                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar7,"test failed.");
                      pcVar8 = std::logic_error::~logic_error;
                      puVar9 = &std::logic_error::typeinfo;
                      goto LAB_001bae05;
                    }
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 0x18);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,
                             local_98);
                  if (local_f8.view_ == (view_pointer)0x0) {
                    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
                  }
                  else {
                    if (local_88.view_ == local_f8.view_) {
                      if (local_f8.index_ == local_88.index_) {
                        pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                 operator--((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                            &local_f8);
                        if ((pIVar6->view_ == (view_pointer)0x0) ||
                           ((pIVar6->view_->geometry_).size_ <= pIVar6->index_)) {
                          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar7,"Assertion failed.");
                          goto LAB_001bb92b;
                        }
                        if (*pIVar6->pointer_ == 0x2e) {
                          if (local_88.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_88.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_88.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_88.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_f8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          operator_delete(local_b8,(long)puStack_a0 * 0x18);
                          operator_delete(_Var4._M_current,8);
                          _Var4._M_current = (unsigned_long *)operator_new(8);
                          *_Var4._M_current = 0x18;
                          local_c8 = (undefined1  [8])this;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)&piStack_c0,_Var4,
                                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      )(_Var4._M_current + 1),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_f8);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
                          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_f8,
                                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,
                                     0xc);
                          if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar7,"test failed.");
                            __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                        std::logic_error::~logic_error);
                          }
                          lVar10 = 0xc;
                          do {
                            if ((local_f8.view_ == (view_pointer)0x0) ||
                               ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar7,"Assertion failed.");
                              pcVar8 = std::runtime_error::~runtime_error;
                              puVar9 = &std::runtime_error::typeinfo;
LAB_001bae37:
                              __cxa_throw(plVar7,puVar9,pcVar8);
                            }
                            if (*local_f8.pointer_ != this->data_[lVar10]) {
                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar7,"test failed.");
                              pcVar8 = std::logic_error::~logic_error;
                              puVar9 = &std::logic_error::typeinfo;
                              goto LAB_001bae37;
                            }
                            andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
                                      (&local_f8);
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 0x18);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
                          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_88,
                                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,
                                     local_98);
                          if (local_f8.view_ == (view_pointer)0x0) {
                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar7,"Assertion failed.");
                          }
                          else {
                            if (local_88.view_ == local_f8.view_) {
                              if (local_f8.index_ == local_88.index_) {
                                pIVar5 = andres::
                                         Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                         operator--(&local_f8);
                                if ((pIVar5->view_ == (view_pointer)0x0) ||
                                   ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
                                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar7,"Assertion failed.");
                                  goto LAB_001bb9ad;
                                }
                                if (*pIVar5->pointer_ == 0x2e) {
                                  if (local_88.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_88.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if (local_f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_f8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                  operator_delete(_Var4._M_current,8);
                                  _Var4._M_current = (unsigned_long *)operator_new(8);
                                  *_Var4._M_current = 0x18;
                                  local_c8 = (undefined1  [8])this;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)&piStack_c0,
                                             _Var4,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)&local_f8);
                                  andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                                local_c8);
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  Iterator((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                           &local_f8,
                                           (View<int,_true,_std::allocator<unsigned_long>_> *)
                                           local_c8,0xc);
                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar7,"test failed.");
                                    __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                                std::logic_error::~logic_error);
                                  }
                                  lVar10 = 0xc;
                                  do {
                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                       ((size_t *)((local_f8.view_)->geometry_).size_ <=
                                        local_f8.index_)) {
                                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                ((runtime_error *)plVar7,"Assertion failed.");
                                      pcVar8 = std::runtime_error::~runtime_error;
                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001bae69:
                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                    }
                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar7,"test failed.");
                                      pcVar8 = std::logic_error::~logic_error;
                                      puVar9 = &std::logic_error::typeinfo;
                                      goto LAB_001bae69;
                                    }
                                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                    operator++((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                *)&local_f8);
                                    lVar10 = lVar10 + 1;
                                  } while (lVar10 != 0x18);
                                  andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                                local_c8);
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  Iterator((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                           &local_88,
                                           (View<int,_true,_std::allocator<unsigned_long>_> *)
                                           local_c8,local_98);
                                  if (local_f8.view_ == (view_pointer)0x0) {
                                    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar7,"Assertion failed.");
                                  }
                                  else {
                                    if (local_88.view_ == local_f8.view_) {
                                      if (local_f8.index_ == local_88.index_) {
                                        pIVar6 = andres::
                                                 Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                 ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                        if ((pIVar6->view_ == (view_pointer)0x0) ||
                                           ((pIVar6->view_->geometry_).size_ <= pIVar6->index_)) {
                                          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar7,"Assertion failed.");
                                          goto LAB_001bba2f;
                                        }
                                        if (*pIVar6->pointer_ == 0x2e) {
                                          if (local_88.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start !=
                                              (pointer)0x0) {
                                            operator_delete(local_88.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                          }
                                          if (local_f8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start !=
                                              (pointer)0x0) {
                                            operator_delete(local_f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                          }
                                          operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                          operator_delete(_Var4._M_current,8);
                                          _Var4._M_current = (unsigned_long *)operator_new(8);
                                          *_Var4._M_current = 0x18;
                                          local_c8 = (undefined1  [8])this;
                                          andres::marray_detail::
                                          Geometry<std::allocator<unsigned_long>>::
                                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Geometry<std::allocator<unsigned_long>> *)
                                                     &piStack_c0,_Var4,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                          ;
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                          andres::
                                          Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                          Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,0xc);
                                          if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar7,"test failed.");
                                            __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          lVar10 = 0xc;
                                          do {
                                            if ((local_f8.view_ == (view_pointer)0x0) ||
                                               ((size_t *)((local_f8.view_)->geometry_).size_ <=
                                                local_f8.index_)) {
                                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar7,"Assertion failed."
                                                        );
                                              pcVar8 = std::runtime_error::~runtime_error;
                                              puVar9 = &std::runtime_error::typeinfo;
LAB_001bae9b:
                                              __cxa_throw(plVar7,puVar9,pcVar8);
                                            }
                                            if (*local_f8.pointer_ != this->data_[lVar10]) {
                                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar7,"test failed.");
                                              pcVar8 = std::logic_error::~logic_error;
                                              puVar9 = &std::logic_error::typeinfo;
                                              goto LAB_001bae9b;
                                            }
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                            lVar10 = lVar10 + 1;
                                          } while (lVar10 != 0x18);
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                          andres::
                                          Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                          Iterator(&local_88,
                                                   (View<int,_false,_std::allocator<unsigned_long>_>
                                                    *)local_c8,local_98);
                                          if (local_f8.view_ == (view_pointer)0x0) {
                                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar7,"Assertion failed.");
                                          }
                                          else {
                                            if (local_88.view_ == local_f8.view_) {
                                              if (local_f8.index_ == local_88.index_) {
                                                pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                   ((pIVar6->view_->geometry_).size_ <=
                                                    pIVar6->index_)) {
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  goto LAB_001bbab1;
                                                }
                                                if (*pIVar6->pointer_ == 0x2e) {
                                                  if (local_88.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  lVar10 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001baecd:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001baecd;
                                                    }
                                                    andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbb01;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  lVar10 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001baeff:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001baeff;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_88,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbb51;
                                                  }
                                                  if (*pIVar6->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,0);
                                                  lVar10 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001baf31:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001baf31;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbba1;
                                                  }
                                                  if (*pIVar6->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar10 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001baf63:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001baf63;
                                                    }
                                                    andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbc23;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar10 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001baf95:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001baf95;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_88,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbca5;
                                                  }
                                                  if (*pIVar6->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar10 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001bafc7:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001bafc7;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbd27;
                                                  }
                                                  if (*pIVar6->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  lVar10 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001baff9:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001baff9;
                                                    }
                                                    andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbd77;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  lVar10 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001bb02b:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001bb02b;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_88,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbdc7;
                                                  }
                                                  if (*pIVar6->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,0);
                                                  lVar10 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001bb05d:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001bb05d;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbe17;
                                                  }
                                                  if (*pIVar6->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar10 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001bb08f:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001bb08f;
                                                    }
                                                    andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbe99;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar10 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001bb0c1:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001bb0c1;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_88,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbf1b;
                                                  }
                                                  if (*pIVar6->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    __cxa_throw(plVar7,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar10 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001bb0f3:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001bb0f3;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    goto LAB_001bbf9d;
                                                  }
                                                  if (*pIVar6->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  local_f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_f8.index_ = 0;
                                                  local_f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_f8.view_ = (view_pointer)0x0;
                                                  local_f8.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_f8);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  local_f8.index_ = local_88.index_;
                                                  local_f8.view_ = local_88.view_;
                                                  local_f8.pointer_ = local_88.pointer_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator=(&local_f8.coordinates_,
                                                              &local_88.coordinates_);
                                                  if (local_88.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  local_88.view_ = local_f8.view_;
                                                  local_88.pointer_ = local_f8.pointer_;
                                                  local_88.index_ = local_f8.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_88.coordinates_,
                                                           &local_f8.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_88);
                                                  lVar10 = 0;
                                                  do {
                                                    if ((local_88.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_88.view_)->geometry_).size_ <=
                                                        local_88.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar9 = &std::runtime_error::typeinfo;
LAB_001bb125:
                                                      __cxa_throw(plVar7,puVar9,pcVar8);
                                                    }
                                                    if (*local_88.pointer_ != this->data_[lVar10]) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar9 = &std::logic_error::typeinfo;
                                                      goto LAB_001bb125;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_88);
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_58,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_88.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((view_pointer)
                                                        CONCAT44(local_58.view_._4_4_,
                                                                 local_58.view_._0_4_) ==
                                                        local_88.view_) {
                                                      if (local_88.index_ == local_58.index_) {
                                                        if (local_58.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (size_t *)0x0) {
                                                    operator_delete(local_58.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_58.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_58.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_88);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar9 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if (*pIVar6->pointer_ == 0x2e) {
                                                      if (local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  return;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bc027;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bc027:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbfab;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbf9d:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbfab:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbf29;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbf1b:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbf29:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbea7;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbe99:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbea7:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbe25;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbe17:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbe25:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbdd5;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbdc7:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbdd5:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbd85;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbd77:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbd85:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbd35;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbd27:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbd35:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbcb3;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbca5:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbcb3:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbc31;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbc23:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbc31:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbbaf;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbba1:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbbaf:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbb5f;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbb51:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbb5f:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                  }
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar9 = &std::logic_error::typeinfo;
                                                  goto LAB_001bbb0f;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
LAB_001bbb01:
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bbb0f:
                                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                                }
                                              }
                                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar7,"test failed.");
                                              pcVar8 = std::logic_error::~logic_error;
                                              puVar9 = &std::logic_error::typeinfo;
                                              goto LAB_001bbabf;
                                            }
                                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar7,"Assertion failed.");
                                          }
LAB_001bbab1:
                                          pcVar8 = std::runtime_error::~runtime_error;
                                          puVar9 = &std::runtime_error::typeinfo;
LAB_001bbabf:
                                          __cxa_throw(plVar7,puVar9,pcVar8);
                                        }
                                      }
                                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar7,"test failed.");
                                      pcVar8 = std::logic_error::~logic_error;
                                      puVar9 = &std::logic_error::typeinfo;
                                      goto LAB_001bba3d;
                                    }
                                    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar7,"Assertion failed.");
                                  }
LAB_001bba2f:
                                  pcVar8 = std::runtime_error::~runtime_error;
                                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bba3d:
                                  __cxa_throw(plVar7,puVar9,pcVar8);
                                }
                              }
                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar7,"test failed.");
                              pcVar8 = std::logic_error::~logic_error;
                              puVar9 = &std::logic_error::typeinfo;
                              goto LAB_001bb9bb;
                            }
                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar7,"Assertion failed.");
                          }
LAB_001bb9ad:
                          pcVar8 = std::runtime_error::~runtime_error;
                          puVar9 = &std::runtime_error::typeinfo;
LAB_001bb9bb:
                          __cxa_throw(plVar7,puVar9,pcVar8);
                        }
                      }
                      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar7,"test failed.");
                      pcVar8 = std::logic_error::~logic_error;
                      puVar9 = &std::logic_error::typeinfo;
                      goto LAB_001bb939;
                    }
                    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
                  }
LAB_001bb92b:
                  pcVar8 = std::runtime_error::~runtime_error;
                  puVar9 = &std::runtime_error::typeinfo;
LAB_001bb939:
                  __cxa_throw(plVar7,puVar9,pcVar8);
                }
              }
              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar7,"test failed.");
              pcVar8 = std::logic_error::~logic_error;
              puVar9 = &std::logic_error::typeinfo;
              goto LAB_001bb8e9;
            }
            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
          }
LAB_001bb8db:
          pcVar8 = std::runtime_error::~runtime_error;
          puVar9 = &std::runtime_error::typeinfo;
LAB_001bb8e9:
          __cxa_throw(plVar7,puVar9,pcVar8);
        }
      }
      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar7,"test failed.");
      pcVar8 = std::logic_error::~logic_error;
      puVar9 = &std::logic_error::typeinfo;
      goto LAB_001bb899;
    }
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
  }
LAB_001bb88b:
  pcVar8 = std::runtime_error::~runtime_error;
  puVar9 = &std::runtime_error::typeinfo;
LAB_001bb899:
  __cxa_throw(plVar7,puVar9,pcVar8);
}

Assistant:

void IteratorTest::constructorTest(){
    // empty
    {
        andres::Iterator<int, constTarget> it;
        test(it.index() == 0);
    }
    // view and index
    {
        // scalar
        {
            int scalar = 42;
            andres::View<int, constTarget> v(&scalar);
            andres::Iterator<int, constTarget> it(v, 0);
            
            test(*it == v(0));
        }
        {
            int scalar = 42;
            const andres::View<int, true> v(&scalar);
            andres::Iterator<int, true> it(v, 0);
            
            test(*it == v(0));
        }
        {
            int scalar = 42;
            andres::View<int, false> v(&scalar);
            andres::Iterator<int, true> it(v, 0);
            
            test(*it == v(0));
        }
        // 1D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
        // 2D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
        // 3D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
    }
    // conversion from mutable to const
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, false> it;
        it = v.begin();
        andres::Iterator<int, true> itc(it);

        for(int i = 0; i < 24; ++i){
            test(*itc == data_[i]);
            ++itc;
        }
        test(itc == v.end());
        test(*(--itc)==46);
    }
}